

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int do_oprom_code(int argc,char **argv)

{
  char **argv_00;
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  img *__ptr;
  char *pcVar4;
  int argc_1;
  int iVar5;
  char *pcVar6;
  igsc_oprom_device_info_4ids *__ptr_00;
  uint i;
  ulong uVar7;
  igsc_oprom_device_info_4ids *info;
  long in_FS_OFFSET;
  size_t sStack_60;
  char local_4a;
  _Bool has_4ids_extension;
  uint32_t count;
  uint32_t img_type;
  igsc_oprom_image *oimg;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    iVar5 = -1;
    if (quiet == '\0') {
      pcVar4 = "Error: Missing arguments\n";
      sStack_60 = 0x19;
LAB_00105d2e:
      iVar5 = -1;
      fwrite(pcVar4,sStack_60,1,_stderr);
    }
    goto LAB_00105efa;
  }
  pcVar4 = *argv;
  iVar5 = argc + -1;
  argv_00 = argv + 1;
  _Var1 = arg_is_token(pcVar4,"version");
  if (_Var1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar5 = do_oprom_version(iVar5,argv_00,IGSC_OPROM_CODE);
      return iVar5;
    }
    goto LAB_001061fb;
  }
  _Var1 = arg_is_token(pcVar4,"update");
  if (_Var1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar5 = do_oprom_update(iVar5,argv_00,IGSC_OPROM_CODE);
      return iVar5;
    }
    goto LAB_001061fb;
  }
  _Var1 = arg_is_token(pcVar4,"supported-devices");
  if (_Var1) {
    if (iVar5 == 2) {
      pcVar4 = *argv_00;
      _Var1 = arg_is_image(pcVar4);
      if (!_Var1) goto LAB_00105e20;
      pcVar4 = argv[2];
      oimg = (igsc_oprom_image *)0x0;
      has_4ids_extension = false;
      local_4a = '\0';
      __ptr = image_read_from_file(pcVar4);
      if (__ptr == (img *)0x0) {
        iVar5 = 1;
        if (quiet != '\0') goto LAB_00105efa;
        pcVar6 = "Error: Failed to read :%s\n";
        goto LAB_00105e42;
      }
      iVar2 = igsc_image_oprom_init(&oimg,__ptr + 1,__ptr->size);
      if (iVar2 == 0) {
        iVar5 = igsc_image_oprom_type(oimg,&img_type);
        if (iVar5 == 0) {
          if ((img_type & 2) == 0) {
            iVar5 = 1;
            if (quiet == '\0') {
              if (img_type < 3) {
                pcVar4 = (&PTR_anon_var_dwarf_40_00113a90)[img_type];
              }
              else {
                pcVar4 = "DATA and CODE";
              }
              __ptr_00 = (igsc_oprom_device_info_4ids *)0x0;
              fprintf(_stderr,"Error: Image type is %s expecting %s\n",pcVar4,"DATA");
              goto LAB_00105ee0;
            }
          }
          else {
            uVar3 = igsc_image_oprom_has_4ids_extension(oimg,2,&has_4ids_extension);
            if (uVar3 != 0) {
              iVar5 = 1;
              if (quiet != '\0') goto LAB_00105edd;
              pcVar4 = "Error: Failed to retrieve the 4ids status of the image: %d\n";
LAB_00105fc7:
              iVar5 = 1;
              __ptr_00 = (igsc_oprom_device_info_4ids *)0x0;
              fprintf(_stderr,pcVar4,(ulong)uVar3);
              goto LAB_00105ee0;
            }
            uVar3 = igsc_image_oprom_has_2ids_extension(oimg,&local_4a);
            if (uVar3 == 0) {
              if (has_4ids_extension == true) {
                if (local_4a == '\x01') {
                  iVar5 = 1;
                  if (quiet == '\0') {
                    pcVar6 = 
                    "Error: Illegal image %s, includes both 2ids and 4ids oprom extensions\n";
                    goto LAB_00105fe9;
                  }
                }
                else {
                  uVar3 = igsc_image_oprom_count_devices_typed(oimg,2,&count);
                  if (uVar3 == 0) {
                    if ((verbose == '\x01') && (quiet == '\0')) {
                      fprintf(_stderr,"Found %d supported devices in image %s\n",(ulong)count,pcVar4
                             );
                    }
                    if ((ulong)count == 0) {
                      if (quiet != '\0') goto LAB_00106052;
                      iVar5 = 0;
                      fprintf(_stdout,"Image %s has empty supported devices list\n",pcVar4);
                    }
                    else {
                      __ptr_00 = (igsc_oprom_device_info_4ids *)calloc((ulong)count,8);
                      iVar5 = 1;
                      if (__ptr_00 != (igsc_oprom_device_info_4ids *)0x0) {
                        uVar3 = igsc_image_oprom_supported_devices_typed(oimg,2,__ptr_00,&count);
                        if (uVar3 != 0) {
                          if (quiet == '\0') {
                            fprintf(_stderr,
                                    "Error: Failed to get %d supported devices from image: %s, ret %d\n"
                                    ,(ulong)count,pcVar4,(ulong)uVar3);
                          }
                          goto LAB_00105ee0;
                        }
                        if (verbose == '\x01') {
                          if (quiet == '\0') {
                            fprintf(_stderr,"Retrieved %d supported devices in image %s\n",
                                    (ulong)count,pcVar4);
                            goto LAB_001061af;
                          }
                        }
                        else {
LAB_001061af:
                          if (quiet == '\0') {
                            fwrite("OPROM Code supported devices:\n",0x1e,1,_stdout);
                          }
                        }
                        iVar5 = 0;
                        info = __ptr_00;
                        for (uVar7 = 0; uVar7 < count; uVar7 = uVar7 + 1) {
                          print_oprom_device_info_4ids(info);
                          info = info + 1;
                        }
                        goto LAB_00105ee0;
                      }
                    }
                  }
                  else {
                    iVar5 = 1;
                    if (quiet == '\0') {
                      __ptr_00 = (igsc_oprom_device_info_4ids *)0x0;
                      fprintf(_stderr,
                              "Error: Failed to count supported devices on image: %s, returned %d\n"
                              ,pcVar4,(ulong)uVar3);
                      goto LAB_00105ee0;
                    }
                  }
                }
              }
              else {
                if (quiet == '\0') {
                  fwrite("OPROM Code image does not have the supported devices extension\n",0x3f,1,
                         _stdout);
                }
LAB_00106052:
                iVar5 = 0;
              }
            }
            else {
              iVar5 = 1;
              if (quiet == '\0') {
                pcVar4 = "Error: Failed to retrieve the 2ids status of the image: %d\n";
                goto LAB_00105fc7;
              }
            }
          }
        }
        else {
          iVar5 = 1;
          if (quiet == '\0') {
            pcVar6 = "Error: Failed to get oprom type from image: %s\n";
            goto LAB_00105fe9;
          }
        }
LAB_00105edd:
        __ptr_00 = (igsc_oprom_device_info_4ids *)0x0;
      }
      else {
        iVar5 = 1;
        if (iVar2 == 5) {
          if (quiet != '\0') goto LAB_00105edd;
          pcVar6 = "Error: Invalid image format: %s\n";
        }
        else {
          if (quiet != '\0') goto LAB_00105edd;
          pcVar6 = "Error: Failed to parse image: %s\n";
        }
LAB_00105fe9:
        iVar5 = 1;
        __ptr_00 = (igsc_oprom_device_info_4ids *)0x0;
        fprintf(_stderr,pcVar6,pcVar4);
      }
LAB_00105ee0:
      igsc_image_oprom_release(oimg);
      free(__ptr);
      free(__ptr_00);
    }
    else {
      iVar5 = -1;
      if (quiet == '\0') {
        pcVar4 = "Error: Wrong number of arguments\n";
        sStack_60 = 0x21;
        goto LAB_00105d2e;
      }
    }
  }
  else {
LAB_00105e20:
    iVar5 = -1;
    if (quiet == '\0') {
      pcVar6 = "Error: Wrong argument %s\n";
LAB_00105e42:
      fprintf(_stderr,pcVar6,pcVar4);
    }
  }
LAB_00105efa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
LAB_001061fb:
  __stack_chk_fail();
}

Assistant:

static int do_oprom_code(int argc, char *argv[])
{
    const char *sub_command = NULL;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    sub_command = argv[0];

    arg_next(&argc, &argv);

    if (arg_is_token(sub_command, "version"))
    {
        return do_oprom_version(argc, argv, IGSC_OPROM_CODE);
    }

    if (arg_is_token(sub_command, "update"))
    {
        return do_oprom_update(argc, argv, IGSC_OPROM_CODE);
    }

    if (arg_is_token(sub_command, "supported-devices"))
    {
        return do_oprom_code_supported_devices(argc, argv);
    }

    fwupd_error("Wrong argument %s\n", sub_command);
    return ERROR_BAD_ARGUMENT;
}